

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O1

void stlez_(double *y,int *n,int *np,int *ns,int *isdeg,int *itdeg,int *robust,int *no,double *rw,
           double *season,double *trend,double *work)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  uint *n_00;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  int local_78 [2];
  int c_false;
  int c_true;
  uint *local_68;
  int local_60;
  uint local_5c;
  int ni;
  uint local_54;
  int ildeg;
  int newnp;
  int local_48;
  int nljump;
  int nsjump;
  int ntjump;
  uint local_34;
  
  local_78[0] = 0;
  local_78[1] = 1;
  _c_false = (ulong)(uint)(*np * 2 + *n);
  ni = *itdeg;
  local_68 = (uint *)n;
  uVar5 = imax(3,*ns);
  ildeg = uVar5 | 1;
  uVar6 = imax(2,*np);
  _nsjump = (double)(int)(uVar5 | 1);
  local_34 = (uint)(((double)(int)uVar6 * 1.5) / (1.0 - 1.5 / _nsjump) + 0.5);
  local_54 = uVar6;
  uVar5 = imax(3,local_34);
  local_60 = (*robust == 0) + 1;
  local_5c = uVar6 | 1;
  local_34 = uVar5 | 1;
  local_48 = imax(1,(int)(_nsjump / 10.0 + 0.9));
  nljump = imax(1,(int)((double)(int)(uVar5 | 1) / 10.0 + 0.9));
  newnp = imax(1,(int)((double)(int)(uVar6 | 1) / 10.0 + 0.9));
  if (0 < (long)(int)*local_68) {
    memset(trend,0,(long)(int)*local_68 << 3);
  }
  n_00 = local_68;
  stlstp_(y,(int *)local_68,(int *)&local_54,&ildeg,(int *)&local_34,(int *)&local_5c,isdeg,itdeg,
          &ni,&local_48,&nljump,&newnp,&local_60,local_78,rw,season,trend,work);
  *no = 0;
  if (*robust == 0) {
    uVar5 = *n_00;
    if (0 < (int)uVar5) {
      uVar9 = 0;
      do {
        rw[uVar9] = 1.0;
        uVar9 = uVar9 + 1;
      } while (uVar5 != uVar9);
    }
  }
  else {
    uVar5 = (uint)_c_false;
    lVar7 = (long)(int)~uVar5;
    _c_false = (ulong)(int)(uVar5 * 7);
    lVar1 = _c_false * 8 + lVar7 * 8;
    lVar2 = (long)(int)(uVar5 * 6) * 8 + lVar7 * 8;
    nsjump = 1;
    while( true ) {
      uVar6 = *n_00;
      if (0 < (int)uVar6) {
        lVar8 = 0;
        do {
          *(undefined8 *)((long)work + lVar8 + lVar2 + 8) = *(undefined8 *)((long)season + lVar8);
          *(undefined8 *)((long)work + lVar8 + lVar1 + 8) = *(undefined8 *)((long)trend + lVar8);
          *(double *)((long)work + lVar8 + (long)(int)uVar5 * 8 + lVar7 * 8 + 8) =
               *(double *)((long)trend + lVar8) + *(double *)((long)season + lVar8);
          lVar8 = lVar8 + 8;
        } while ((ulong)uVar6 << 3 != lVar8);
      }
      stlrwt_(y,(int *)n_00,work,rw);
      stlstp_(y,(int *)local_68,(int *)&local_54,&ildeg,(int *)&local_34,(int *)&local_5c,isdeg,
              itdeg,&ni,&local_48,&nljump,&newnp,&local_60,local_78 + 1,rw,season,trend,work);
      *no = *no + 1;
      dVar14 = work[lVar7 + (int)(uVar5 * 6 + 1)];
      dVar13 = work[lVar7 + _c_false + 1];
      dVar10 = ABS(dVar14 - *season);
      dVar11 = ABS(dVar13 - *trend);
      dVar16 = dVar13;
      dVar17 = dVar14;
      if (1 < (int)*local_68) {
        lVar8 = 0;
        dVar12 = dVar13;
        dVar15 = dVar13;
        dVar18 = dVar14;
        do {
          dVar3 = *(double *)((long)work + lVar8 + lVar2 + 0x10);
          dVar13 = dVar3;
          if (dVar3 <= dVar14) {
            dVar13 = dVar14;
          }
          dVar14 = dVar13;
          dVar4 = *(double *)((long)work + lVar8 + lVar1 + 0x10);
          dVar13 = dVar4;
          if (dVar4 <= dVar12) {
            dVar13 = dVar12;
          }
          dVar17 = dVar3;
          if (dVar18 <= dVar3) {
            dVar17 = dVar18;
          }
          dVar16 = dVar4;
          if (dVar15 <= dVar4) {
            dVar16 = dVar15;
          }
          dVar15 = ABS(dVar3 - *(double *)((long)season + lVar8 + 8));
          dVar12 = ABS(dVar4 - *(double *)((long)trend + lVar8 + 8));
          if (dVar15 <= dVar10) {
            dVar15 = dVar10;
          }
          dVar10 = dVar15;
          if (dVar12 <= dVar11) {
            dVar12 = dVar11;
          }
          dVar11 = dVar12;
          lVar8 = lVar8 + 8;
          dVar12 = dVar13;
          dVar15 = dVar16;
          dVar18 = dVar17;
        } while ((ulong)*local_68 * 8 + -8 != lVar8);
      }
      if (((dVar10 / (dVar14 - dVar17) < 0.01) && (dVar11 / (dVar13 - dVar16) < 0.01)) ||
         (0xe < (uint)nsjump)) break;
      nsjump = nsjump + 1;
      n_00 = local_68;
    }
  }
  return;
}

Assistant:

void stlez_(double *y, int *n, int *np, int *ns, int *isdeg, int *itdeg,int *robust, int *no, 
	double *rw, double *season, double *trend, double *work)
{
    /* System generated locals */
    int work_dim1, work_offset, i__1, i__2;
    double d__1;

    /* Local variables */
    int i__, j, ni, nl, nt;
    double difs, dift, mins, mint, maxs, maxt;
    int ildeg;
    double maxds, maxdt;
    int newnp, newns, nljump, nsjump, ntjump;
	int c_false = 0;
	int c_true = 1;

		// Robust

/* Arg */
/* Var */
    /* Parameter adjustments */
    --trend;
    --season;
    --rw;
    --y;
    work_dim1 = *n + 2 * *np;
    work_offset = 1 + work_dim1;
    work -= work_offset;

    /* Function Body */
    ildeg = *itdeg;
    newns = imax(3,*ns);
    if (newns % 2 == 0) {
	++newns;
    }
    newnp = imax(2,*np);
    nt = newnp * 1.5 / (1 - 1.5 / newns) + .5;
    nt = imax(3,nt);
    if (nt % 2 == 0) {
	++nt;
    }
    nl = newnp;
    if (nl % 2 == 0) {
	++nl;
    }
    if (*robust) {
	ni = 1;
    } else {
	ni = 2;
    }
/* Computing MAX */
    i__1 = 1, i__2 = (int) ((double) newns / 10 + .9);
    nsjump = imax(i__1,i__2);
/* Computing MAX */
    i__1 = 1, i__2 = (int) ((double) nt / 10 + .9);
    ntjump = imax(i__1,i__2);
/* Computing MAX */
    i__1 = 1, i__2 = (int) ((double) nl / 10 + .9);
    nljump = imax(i__1,i__2);
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	trend[i__] = 0.0;
/* L2: */
    }
    stlstp_(&y[1], n, &newnp, &newns, &nt, &nl, isdeg, itdeg, &ildeg, &nsjump,
	     &ntjump, &nljump, &ni, &c_false, &rw[1], &season[1], &trend[1], &
	    work[work_offset]);
    *no = 0;
    if (*robust) {
	j = 1;
/*        Loop  --- 15 robustness iterations */
L100:
	if (j <= 15) {
	    i__1 = *n;
	    for (i__ = 1; i__ <= i__1; ++i__) {
		work[i__ + work_dim1 * 6] = season[i__];
		work[i__ + work_dim1 * 7] = trend[i__];
		work[i__ + work_dim1] = trend[i__] + season[i__];
/* L35: */
	    }
	    stlrwt_(&y[1], n, &work[work_dim1 + 1], &rw[1]);
	    stlstp_(&y[1], n, &newnp, &newns, &nt, &nl, isdeg, itdeg, &ildeg, 
		    &nsjump, &ntjump, &nljump, &ni, &c_true, &rw[1], &season[
		    1], &trend[1], &work[work_offset]);
	    ++(*no);
	    maxs = work[work_dim1 * 6 + 1];
	    mins = work[work_dim1 * 6 + 1];
	    maxt = work[work_dim1 * 7 + 1];
	    mint = work[work_dim1 * 7 + 1];
	    maxds = (d__1 = work[work_dim1 * 6 + 1] - season[1], fabs(d__1));
	    maxdt = (d__1 = work[work_dim1 * 7 + 1] - trend[1], fabs(d__1));
	    i__1 = *n;
	    for (i__ = 2; i__ <= i__1; ++i__) {
		if (maxs < work[i__ + work_dim1 * 6]) {
		    maxs = work[i__ + work_dim1 * 6];
		}
		if (maxt < work[i__ + work_dim1 * 7]) {
		    maxt = work[i__ + work_dim1 * 7];
		}
		if (mins > work[i__ + work_dim1 * 6]) {
		    mins = work[i__ + work_dim1 * 6];
		}
		if (mint > work[i__ + work_dim1 * 7]) {
		    mint = work[i__ + work_dim1 * 7];
		}
		difs = (d__1 = work[i__ + work_dim1 * 6] - season[i__], fabs(
			d__1));
		dift = (d__1 = work[i__ + work_dim1 * 7] - trend[i__], fabs(
			d__1));
		if (maxds < difs) {
		    maxds = difs;
		}
		if (maxdt < dift) {
		    maxdt = dift;
		}
/* L137: */
	    }
	    if (maxds / (maxs - mins) < .01 && maxdt / (maxt - mint) < .01) 
		    {
		goto L300;
	    }
/* L151: */
	    ++j;
	    goto L100;
	}
/*        end Loop */
L300:
	;
    } else {
/*     	.not. robust */
	i__1 = *n;
	for (i__ = 1; i__ <= i__1; ++i__) {
	    rw[i__] = 1.0;
/* L150: */
	}
    }
}